

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_BBANDS_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                 int *outNBElement)

{
  TA_RetCode TVar1;
  undefined4 in_EDX;
  double unaff_RBX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  double unaff_retaddr;
  int in_stack_0000000c;
  double *in_stack_00000010;
  int in_stack_0000001c;
  double *in_stack_00000040;
  double *in_stack_00000048;
  
  TVar1 = TA_BBANDS((int)outNBElement,in_stack_0000001c,in_stack_00000010,in_stack_0000000c,
                    unaff_retaddr,unaff_RBX,(TA_MAType)((ulong)in_RDI >> 0x20),
                    (int *)CONCAT44(in_ESI,in_EDX),(int *)CONCAT44(startIdx,endIdx),(double *)params
                    ,in_stack_00000040,in_stack_00000048);
  return TVar1;
}

Assistant:

TA_RetCode TA_BBANDS_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_BBANDS(
/* Generated */                startIdx,
/* Generated */                endIdx,
/* Generated */                params->in[0].data.inReal, /* inReal */
/* Generated */                params->optIn[0].data.optInInteger, /* optInTimePeriod*/
/* Generated */                params->optIn[1].data.optInReal, /* optInNbDevUp*/
/* Generated */                params->optIn[2].data.optInReal, /* optInNbDevDn*/
/* Generated */                (TA_MAType)params->optIn[3].data.optInInteger, /* optInMAType*/
/* Generated */                outBegIdx, 
/* Generated */                outNBElement, 
/* Generated */                params->out[0].data.outReal, /*  outRealUpperBand */
/* Generated */                params->out[1].data.outReal, /*  outRealMiddleBand */
/* Generated */                params->out[2].data.outReal /*  outRealLowerBand */ );
/* Generated */ }